

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void Bpgetrast(char *fn,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  uint uVar4;
  ulong uVar5;
  int extraout_EDX;
  long extraout_RDX;
  ulong unaff_RBX;
  int *unaff_RBP;
  int iVar6;
  byte *__buf;
  byte *pbVar7;
  int iVar8;
  undefined8 in_R9;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  byte *unaff_R13;
  ulong uVar12;
  long lVar13;
  byte *__buf_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  uchar c;
  byte bStack_8d;
  uint uStack_8c;
  ulong uStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  byte *pbStack_68;
  float *pfStack_60;
  byte *pbStack_58;
  code *pcStack_50;
  byte local_45;
  uint local_44;
  byte *local_40;
  long local_38;
  
  uVar5 = (ulong)(uint)r;
  uVar10 = (ulong)(uint)r;
  pbVar7 = (byte *)(ulong)(uint)sy;
  __buf = (byte *)0x0;
  pcStack_50 = (code *)0x102f34;
  local_44 = sx;
  uVar4 = sy;
  uVar1 = open(fn,0);
  uVar2 = (uint)uVar5;
  iVar8 = (int)in_R9;
  __buf_00 = pbVar7;
  if (0 < (int)uVar1) {
    unaff_RBP = (int *)(ulong)uVar1;
    if (0 < sy) {
      unaff_RBX = (ulong)local_44;
      local_38 = (long)r << 2;
      unaff_R13 = (byte *)0x0;
      __buf_00 = &local_45;
      local_40 = pbVar7;
      do {
        if (0 < (int)local_44) {
          uVar10 = 0;
          do {
            pcStack_50 = (code *)0x102f7c;
            __buf = __buf_00;
            fn = (char *)unaff_RBP;
            sVar3 = read(uVar1,__buf_00,1);
            uVar4 = (uint)pbVar7;
            uVar2 = (uint)uVar5;
            iVar8 = (int)in_R9;
            if (sVar3 != 1) {
              pcStack_50 = (code *)0x102fc5;
              Bpgetrast_cold_2();
              goto LAB_00102fc5;
            }
            bf[uVar10] = (float)local_45;
            uVar10 = uVar10 + 1;
          } while (unaff_RBX != uVar10);
        }
        unaff_R13 = unaff_R13 + 1;
        bf = (float *)((long)bf + local_38);
      } while (unaff_R13 != local_40);
    }
    close(uVar1);
    return;
  }
LAB_00102fc5:
  pcStack_50 = pputrast;
  Bpgetrast_cold_1();
  uVar5 = (ulong)uVar2;
  pbVar7 = (byte *)0x180;
  uStack_8c = uVar4;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar10;
  pbStack_68 = unaff_R13;
  pfStack_60 = bf;
  pbStack_58 = __buf_00;
  pcStack_50 = (code *)unaff_RBP;
  uVar1 = creat(fn,0x180);
  if ((int)uVar1 < 1) {
LAB_00103094:
    pputrast_cold_1();
  }
  else {
    fn = (char *)(ulong)uVar1;
    sVar3 = write(uVar1,__buf,0x20);
    pbVar7 = __buf;
    if (sVar3 == 0x20) {
      if (0 < (int)uVar2) {
        uVar10 = (ulong)uStack_8c;
        lStack_80 = (long)iVar8 << 2;
        uVar12 = 0;
        lVar13 = extraout_RDX;
        uStack_88 = uVar5;
        do {
          if (0 < (int)uStack_8c) {
            uVar11 = 0;
            do {
              bStack_8d = (byte)(int)*(float *)(lVar13 + uVar11 * 4);
              fn = (char *)(ulong)uVar1;
              pbVar7 = &bStack_8d;
              sVar3 = write(uVar1,&bStack_8d,1);
              uVar4 = (uint)uVar5;
              if (sVar3 != 1) {
                pputrast_cold_3();
                goto LAB_00103094;
              }
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + lStack_80;
        } while (uVar12 != uStack_88);
      }
      close(uVar1);
      return;
    }
  }
  pputrast_cold_2();
  if (0 < (int)uVar4) {
    uVar2 = 0;
    iVar8 = extraout_EDX;
    uVar1 = uVar4;
    do {
      do {
        iVar6 = (int)pbVar7;
        *(ulong *)(*(long *)((long)fn + 0x158) + (long)(*(int *)fn * iVar6 + iVar8) * 8) =
             CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        lVar13 = *(long *)((long)fn + ((long)(*(int *)((long)fn + 0xc) / 2) * 2 + 0x2e) * 4);
        lVar9 = (long)(*(int *)fn * iVar6 + iVar8) * 0x30;
        *(float *)(lVar13 + 0x24 + lVar9) = (float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
        *(float *)(lVar13 + 0x28 + lVar9) = (float)(double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
        iVar8 = iVar8 + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      uVar2 = uVar2 + 1;
      pbVar7 = (byte *)(ulong)(iVar6 + 1);
      iVar8 = extraout_EDX;
      uVar1 = uVar4;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

void Bpgetrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        if (read(fd,&c,sizeof(c)) != 1) {
          error(4) ;
        }
        bf[r*i + j] = (float)c ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}